

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dwarf_macro5.c
# Opt level: O0

int validate_opcode(Dwarf_Debug dbg,Dwarf_Macro_Forms_s *curform,Dwarf_Error *error)

{
  Dwarf_Macro_Forms_s *stdfptr;
  uint i;
  Dwarf_Error *error_local;
  Dwarf_Macro_Forms_s *curform_local;
  Dwarf_Debug dbg_local;
  
  if (curform->mf_code < 0xe0) {
    if (curform->mf_code < 0xd) {
      if (curform->mf_code == '\0') {
        _dwarf_error(dbg,error,0x13f);
        dbg_local._4_4_ = 1;
      }
      else if (curform->mf_formcount == dw5formsarray[curform->mf_code].mf_formcount) {
        for (stdfptr._4_4_ = 0; stdfptr._4_4_ < curform->mf_formcount;
            stdfptr._4_4_ = stdfptr._4_4_ + 1) {
          if (curform->mf_formbytes[stdfptr._4_4_] !=
              dw5formsarray[curform->mf_code].mf_formbytes[1]) {
            _dwarf_error(dbg,error,0x140);
            return 1;
          }
        }
        dbg_local._4_4_ = 0;
      }
      else {
        _dwarf_error(dbg,error,0x140);
        dbg_local._4_4_ = 1;
      }
    }
    else {
      _dwarf_error(dbg,error,0x13f);
      dbg_local._4_4_ = 1;
    }
  }
  else {
    dbg_local._4_4_ = 0;
  }
  return dbg_local._4_4_;
}

Assistant:

static int
validate_opcode(Dwarf_Debug dbg,
    struct Dwarf_Macro_Forms_s *curform,
    Dwarf_Error * error)
{
    unsigned i = 0;
    struct Dwarf_Macro_Forms_s *stdfptr = 0;
    if (curform->mf_code >= DW_MACRO_lo_user) {
        /* Nothing to check. user level. */
        return DW_DLV_OK;
    }
    if (curform->mf_code > DW_MACRO_undef_strx) {
        _dwarf_error(dbg, error, DW_DLE_MACRO_OPCODE_BAD);
        return DW_DLV_ERROR;
    }
    if (!curform->mf_code){
        _dwarf_error(dbg, error, DW_DLE_MACRO_OPCODE_BAD);
        return DW_DLV_ERROR;
    }
    stdfptr = &dwarf_default_macro_opslist.mol_data[curform->mf_code];

    if (curform->mf_formcount != stdfptr->mf_formcount) {
        _dwarf_error(dbg, error, DW_DLE_MACRO_OPCODE_FORM_BAD);
        return DW_DLV_ERROR;
    }
    for (i = 0; i < curform->mf_formcount; ++i) {
        if (curform->mf_formbytes[i] != stdfptr->mf_formbytes[1]) {
            _dwarf_error(dbg, error, DW_DLE_MACRO_OPCODE_FORM_BAD);
            return DW_DLV_ERROR;
        }
    }
    return DW_DLV_OK;
}